

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
binary_search_impl<long,phmap::Less<long>>
          (btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
           *this,long *k,int s,int e,Less<long> *comp)

{
  bool bVar1;
  int iVar2;
  key_type *a;
  int mid;
  Less<long> *comp_local;
  int e_local;
  int s_local;
  long *k_local;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *this_local;
  
  iVar2 = e;
  comp_local._4_4_ = s;
  while (comp_local._0_4_ = iVar2, comp_local._4_4_ != (int)comp_local) {
    iVar2 = comp_local._4_4_ + (int)comp_local >> 1;
    a = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
        ::key((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
               *)this,(long)iVar2);
    bVar1 = Less<long>::operator()(comp,a,k);
    if (bVar1) {
      comp_local._4_4_ = iVar2 + 1;
      iVar2 = (int)comp_local;
    }
  }
  return (SearchResult<int,_false>)comp_local._4_4_;
}

Assistant:

SearchResult<int, false> binary_search_impl(
            const K &k, int s, int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s != e) {
                const int mid = (s + e) >> 1;
                if (comp(key(mid), k)) {
                    s = mid + 1;
                } else {
                    e = mid;
                }
            }
            return {s};
        }